

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O2

int main(void)

{
  timer func;
  long lVar1;
  native_type nVar2;
  ostream *poVar3;
  ptime pVar4;
  canceler func_00;
  undefined1 auVar5 [12];
  io_service srv;
  sock1 s1;
  uint uStack_4c;
  sock2 s2;
  callback<void_(const_std::error_code_&)> local_30;
  native_type fds_1 [2];
  native_type fds [2];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Testing IO events");
  std::endl<char,std::char_traits<char>>(poVar3);
  booster::aio::io_service::io_service(&srv);
  pair(fds);
  s1.fd = fds[0];
  s1.counter = 0;
  s2.fd = fds[1];
  s2.counter = 0;
  s1.srv = &srv;
  s2.srv = &srv;
  sock1::async_run(&s1);
  sock2::async_run(&s2);
  booster::aio::io_service::run();
  if (done == false) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar3 = std::operator<<(poVar3,"done");
    poVar3 = std::operator<<(poVar3," at ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,199);
    std::endl<char,std::char_traits<char>>(poVar3);
    return_code = 1;
  }
  booster::aio::io_service::reset();
  poVar3 = std::operator<<((ostream *)&std::cout,"Testing timer events");
  std::endl<char,std::char_traits<char>>(poVar3);
  s1._0_8_ = &srv;
  auVar5 = booster::ptime::now();
  s2._0_8_ = auVar5._0_8_;
  s2.srv = (io_service *)CONCAT44(s2.srv._4_4_,auVar5._8_4_);
  pVar4 = booster::ptime::milliseconds(100);
  fds = (native_type  [2])pVar4.sec;
  pVar4 = booster::ptime::operator+((ptime *)&s2,(ptime *)fds);
  s1.srv = (io_service *)pVar4.sec;
  s1.counter = pVar4.nsec;
  uStack_4c = uStack_4c & 0xffffff00;
  func.t._12_4_ = s1._20_4_;
  func.t.nsec = s1.counter;
  lVar1 = (ulong)uStack_4c << 0x20;
  func.t.sec = (longlong)s1.srv;
  func.srv = (io_service *)s1._0_8_;
  func.event_id = (int)lVar1;
  func.cancel = (bool)(char)((ulong)lVar1 >> 0x20);
  func._29_3_ = (int3)((ulong)lVar1 >> 0x28);
  booster::callback<void_(const_std::error_code_&)>::callback<timer>
            ((callback<void_(const_std::error_code_&)> *)&s2,func);
  booster::aio::io_service::set_timer_event((ptime *)&srv,(callback *)&s1.srv);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&s2);
  booster::aio::io_service::run();
  if (timer_done == false) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar3 = std::operator<<(poVar3,"timer_done");
    poVar3 = std::operator<<(poVar3," at ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xcf);
    std::endl<char,std::char_traits<char>>(poVar3);
    return_code = 1;
  }
  booster::aio::io_service::reset();
  poVar3 = std::operator<<((ostream *)&std::cout,"Testing IO events cancelation");
  std::endl<char,std::char_traits<char>>(poVar3);
  pair(fds_1);
  nVar2 = fds_1[0];
  booster::callback<void_(const_std::error_code_&)>::callback<cancel_handler>
            ((callback<void_(const_std::error_code_&)> *)&s1,&srv);
  booster::aio::io_service::set_io_event((int)&srv,nVar2,(callback *)0x1);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&s1);
  auVar5 = booster::ptime::now();
  s2._0_8_ = auVar5._0_8_;
  s2.srv = (io_service *)CONCAT44(s2.srv._4_4_,auVar5._8_4_);
  pVar4 = booster::ptime::milliseconds(100);
  fds = (native_type  [2])pVar4.sec;
  pVar4 = booster::ptime::operator+((ptime *)&s2,(ptime *)fds);
  s1._0_8_ = pVar4.sec;
  s1.srv = (io_service *)CONCAT44(s1.srv._4_4_,pVar4.nsec);
  func_00._4_4_ = 0;
  func_00.fd = fds_1[0];
  func_00.srv = &srv;
  booster::callback<void_(const_std::error_code_&)>::callback<canceler>(&local_30,func_00);
  booster::aio::io_service::set_timer_event((ptime *)&srv,(callback *)&s1);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            (&local_30.call_ptr);
  booster::aio::io_service::run();
  if (cancel_called != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar3 = std::operator<<(poVar3,"cancel_called==1");
    poVar3 = std::operator<<(poVar3," at ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xdb);
    std::endl<char,std::char_traits<char>>(poVar3);
    return_code = 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Testing post()");
  std::endl<char,std::char_traits<char>>(poVar3);
  if (post_executed == false) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar3 = std::operator<<(poVar3,"post_executed");
    poVar3 = std::operator<<(poVar3," at ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xdd);
    std::endl<char,std::char_traits<char>>(poVar3);
    return_code = 1;
  }
  the_service = &srv;
  booster::aio::io_service::reset();
  poVar3 = std::operator<<((ostream *)&std::cout,"Testing adding invalid socket id");
  std::endl<char,std::char_traits<char>>(poVar3);
  booster::callback<void(std::error_code_const&)>::callback<void(*)(std::error_code_const&)>
            ((callback<void(std::error_code_const&)> *)&s1,got_error);
  booster::aio::io_service::set_io_event((int)&srv,-1,(callback *)0x1);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&s1);
  got_error_called = false;
  booster::aio::io_service::run();
  if (got_error_called == false) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar3 = std::operator<<(poVar3,"got_error_called");
    poVar3 = std::operator<<(poVar3," at ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xe6);
    std::endl<char,std::char_traits<char>>(poVar3);
    return_code = 1;
  }
  booster::aio::io_service::reset();
  poVar3 = std::operator<<((ostream *)&std::cout,"Testing event from other thread");
  std::endl<char,std::char_traits<char>>(poVar3);
  post_executed = false;
  std::thread::thread<void(&)(),,void>((thread *)&s1,poster);
  booster::aio::io_service::run();
  std::thread::join();
  if (post_executed == false) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar3 = std::operator<<(poVar3,"post_executed");
    poVar3 = std::operator<<(poVar3," at ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xef);
    std::endl<char,std::char_traits<char>>(poVar3);
    return_code = 1;
  }
  std::thread::~thread((thread *)&s1);
  booster::aio::io_service::~io_service(&srv);
  if (return_code == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Ok");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return return_code;
}

Assistant:

int main()
{
	try {
		std::cout << "Testing IO events" << std::endl;
		booster::aio::io_service srv;
		{
			booster::aio::native_type fds[2];
			pair(fds);
			sock1 s1(fds[0],&srv);
			sock2 s2(fds[1],&srv);
			s1.async_run();
			s2.async_run();
			srv.run();
			TEST(done);
		}
		srv.reset();
		{
			std::cout << "Testing timer events" << std::endl;
			timer tt = { &srv, booster::ptime::now() + ptime::milliseconds(100), 0, false };
			srv.set_timer_event(tt.t,tt);
			srv.run();
			TEST(timer_done);
		}
		srv.reset();
		{
			std::cout << "Testing IO events cancelation" << std::endl;
			booster::aio::native_type fds[2];
			pair(fds);
			cancel_handler ch = { &srv };
			srv.set_io_event(fds[0],booster::aio::io_service::in,ch);
			canceler c = { fds[0], &srv };
			srv.set_timer_event(booster::ptime::now() + ptime::milliseconds(100),c);
			srv.run();
			TEST(cancel_called==1);
			std::cout << "Testing post()" << std::endl;
			TEST(post_executed);
		}
		the_service = &srv;
		srv.reset();
		{
			std::cout << "Testing adding invalid socket id" << std::endl;
			srv.set_io_event(booster::aio::invalid_socket,booster::aio::io_service::in,got_error);
			got_error_called = false;
			srv.run();
			TEST(got_error_called);
		}
		srv.reset();
		{
			std::cout << "Testing event from other thread" << std::endl;
			post_executed = false;
			booster::thread p(poster);
			srv.run();
			p.join();
			TEST(post_executed);
		}
	}
	catch(std::exception const &e)
	{
		std::cout<<"Failed:"<< e.what() << std::endl;
		return 1;
	}
	if(return_code == 0)
		std::cout << "Ok" << std::endl;
	return return_code;
}